

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iffl_list.h
# Opt level: O2

void __thiscall
iffl::
flat_forward_list<pod_array_list_entry<char>,_iffl::flat_forward_list_traits<pod_array_list_entry<char>_>,_std::pmr::polymorphic_allocator<char>_>
::resize_buffer(flat_forward_list<pod_array_list_entry<char>,_iffl::flat_forward_list_traits<pod_array_list_entry<char>_>,_std::pmr::polymorphic_allocator<char>_>
                *this,size_type size)

{
  buffer_t<char> *this_00;
  memory_resource *pmVar1;
  default_validate_element_fn<pod_array_list_entry<char>,_iffl::flat_forward_list_traits<pod_array_list_entry<char>_>_>
  *in_R8;
  ushort *puVar2;
  long lVar3;
  pointer_type pcVar4;
  char *new_buffer;
  char local_a1;
  size_t new_buffer_size;
  pointer_type local_98;
  pointer_type pcStack_90;
  pointer_type local_88;
  scope_guard<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_vladp72[P]iffl_include_iffl_list_h:5640:33)>
  deallocate_buffer;
  pair<bool,_iffl::flat_forward_list_ref<pod_array_list_entry<char>,_iffl::flat_forward_list_traits<pod_array_list_entry<char>_>_>_>
  local_60;
  sizes_t prev_sizes;
  
  this_00 = &(this->buffer_).v2_;
  buffer_t<char>::validate(this_00);
  get_all_sizes(&prev_sizes,this);
  deallocate_buffer.super_anon_class_24_3_566c83a5.buffer = &new_buffer;
  new_buffer = (char *)0x0;
  deallocate_buffer.super_anon_class_24_3_566c83a5.buffer_size = &new_buffer_size;
  new_buffer_size = 0;
  deallocate_buffer.armed_ = true;
  deallocate_buffer.super_anon_class_24_3_566c83a5.this =
       (flat_forward_list<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>,_std::pmr::polymorphic_allocator<char>_>
        *)this;
  if (prev_sizes.total_capacity < size) {
    pmVar1 = (this->buffer_).v1_._M_resource;
    new_buffer = (char *)(**(code **)(*(long *)pmVar1 + 0x10))(pmVar1,size,1);
    new_buffer_size = size;
    if ((this->buffer_).v2_.last != (pointer_type)0x0) {
      memcpy(new_buffer,(this->buffer_).v2_.begin,prev_sizes.last_element.super_range.data_end);
      (this->buffer_).v2_.last = new_buffer + prev_sizes.last_element.super_range.buffer_begin;
    }
  }
  else {
    if (size == 0) {
      clear(this);
      goto LAB_0010cb86;
    }
    if (prev_sizes.total_capacity <= size) goto LAB_0010cb86;
    pmVar1 = (this->buffer_).v1_._M_resource;
    new_buffer = (char *)(**(code **)(*(long *)pmVar1 + 0x10))(pmVar1,size,1);
    if (size < prev_sizes.last_element.super_range.data_end) {
      new_buffer_size = size;
      flat_forward_list_validate_no_next_offset<pod_array_list_entry<char>,iffl::flat_forward_list_traits<pod_array_list_entry<char>>,iffl::default_validate_element_fn<pod_array_list_entry<char>,iffl::flat_forward_list_traits<pod_array_list_entry<char>>>>
                (&local_60,(iffl *)this_00->begin,(char *)((iffl *)this_00->begin + size),&local_a1,
                 in_R8);
      local_98 = local_60.second.buffer_.begin;
      pcStack_90 = local_60.second.buffer_.last;
      local_88 = local_60.second.buffer_.end;
      if (local_60.first == true) {
        flat_forward_list_ref<pod_array_list_entry<char>,_iffl::flat_forward_list_traits<pod_array_list_entry<char>_>_>
        ::last((flat_forward_list_ref<pod_array_list_entry<char>,_iffl::flat_forward_list_traits<pod_array_list_entry<char>_>_>
                *)&local_60);
        if ((pointer_type)CONCAT71(local_60._1_7_,local_60.first) != (this->buffer_).v2_.last) {
LAB_0010cb02:
          std::terminate();
        }
      }
      else {
        flat_forward_list_ref<pod_array_list_entry<char>,_iffl::flat_forward_list_traits<pod_array_list_entry<char>_>_>
        ::last((flat_forward_list_ref<pod_array_list_entry<char>,_iffl::flat_forward_list_traits<pod_array_list_entry<char>_>_>
                *)&local_60);
        if ((pointer_type)CONCAT71(local_60._1_7_,local_60.first) == (this->buffer_).v2_.last)
        goto LAB_0010cb02;
      }
      flat_forward_list_ref<pod_array_list_entry<char>,_iffl::flat_forward_list_traits<pod_array_list_entry<char>_>_>
      ::last((flat_forward_list_ref<pod_array_list_entry<char>,_iffl::flat_forward_list_traits<pod_array_list_entry<char>_>_>
              *)&local_60);
      puVar2 = (ushort *)CONCAT71(local_60._1_7_,local_60.first);
    }
    else {
      puVar2 = (ushort *)(this->buffer_).v2_.last;
      new_buffer_size = size;
    }
    if (puVar2 == (ushort *)0x0) {
      pcVar4 = (pointer_type)0x0;
    }
    else {
      lVar3 = (long)puVar2 - (long)this_00->begin;
      memcpy(new_buffer,this_00->begin,(ulong)*puVar2 + lVar3 + 2);
      pcVar4 = new_buffer + lVar3;
    }
    (this->buffer_).v2_.last = pcVar4;
  }
  commit_new_buffer(this,&new_buffer,&new_buffer_size);
  (this->buffer_).v2_.end = (this->buffer_).v2_.begin + size;
LAB_0010cb86:
  buffer_t<char>::validate(this_00);
  validate_data_invariants(this);
  scope_guard<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/vladp72[P]iffl/include/iffl_list.h:5640:33)>
  ::discharge(&deallocate_buffer);
  return;
}

Assistant:

void resize_buffer(size_type size) {
        validate_pointer_invariants();

        sizes_t const prev_sizes{ get_all_sizes() };

        char *new_buffer{ nullptr };
        size_t new_buffer_size{ 0 };
        auto deallocate_buffer{ make_scoped_deallocator(&new_buffer, &new_buffer_size) };
        //
        // growing capacity
        //
        if (prev_sizes.total_capacity < size) {
            new_buffer = allocate_buffer(size);
            new_buffer_size = size;
            if (nullptr != buff().last) {
                copy_data(new_buffer, buff().begin, prev_sizes.used_capacity().size);
                buff().last = new_buffer + prev_sizes.last_element.begin();
            }
            commit_new_buffer(new_buffer, new_buffer_size);
            buff().end = buff().begin + size;
        //
        // shrinking to 0 is simple
        //
        } else if (0 == size) {
            clear();
        //
        // to shrink to a smaller size we first need to 
        // find last element that would completely fit 
        // in the new buffer, and if we found any, then
        // make it new last element. If we did not find 
        // any, then designate that there are no last 
        // element
        //
        } else if (prev_sizes.total_capacity > size) {

            new_buffer = allocate_buffer(size);
            new_buffer_size = size;

            bool is_valid{ true };
            char *last_valid{ buff().last };
            //
            // If we are shrinking below used capacity then last element will
            // be removed, and we need to do linear search for the new last element 
            // that would fit new buffer size.
            //
            if (prev_sizes.used_capacity().size > size) {
                flat_forward_list_ref<T, TT> buffer_view;
                std::tie(is_valid, buffer_view) = flat_forward_list_validate<T, TT>(buff().begin,
                                                                                    buff().begin + size);
                if (is_valid) {
                    FFL_CODDING_ERROR_IF_NOT(buffer_view.last().get_ptr() == buff().last);
                } else {
                    FFL_CODDING_ERROR_IF_NOT(buffer_view.last().get_ptr() != buff().last);
                }
                last_valid = buffer_view.last().get_ptr();
            }

            if (last_valid) {
                size_type new_last_element_offset = last_valid - buff().begin;

                size_with_padding_t const last_valid_element_size{ traits_traits::get_size(last_valid) };
                size_type const new_used_capacity{ new_last_element_offset + last_valid_element_size.size };
                
                set_no_next_element(last_valid);
                
                copy_data(new_buffer, buff().begin, new_used_capacity);
                buff().last = new_buffer + new_last_element_offset;
            } else {
                buff().last = nullptr;
            }

            commit_new_buffer(new_buffer, new_buffer_size);
            buff().end = buff().begin + size;
        }

        validate_pointer_invariants();
        validate_data_invariants();
    }